

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_stat_modifiers(textblock *tb,player_shape *s)

{
  short sVar1;
  obj_property *poVar2;
  char *item;
  wchar_t local_2c;
  wchar_t local_28;
  wchar_t i;
  wchar_t n;
  wchar_t nmax;
  char **msgs;
  player_shape *s_local;
  textblock *tb_local;
  
  _n = (char **)0x0;
  i = L'\0';
  local_28 = L'\0';
  msgs = (char **)s;
  s_local = (player_shape *)tb;
  for (local_2c = L'\0'; local_2c < L'\x05'; local_2c = local_2c + L'\x01') {
    if (*(short *)((long)msgs + (long)local_2c * 2 + 0x58) != 0) {
      sVar1 = *(short *)((long)msgs + (long)local_2c * 2 + 0x58);
      poVar2 = lookup_obj_property(L'\x02',local_2c);
      item = format("%+d to %s",(ulong)(uint)(int)sVar1,poVar2->name);
      shape_lore_helper_append_to_list(item,(char ***)&n,&i,&local_28);
    }
  }
  if (L'\0' < local_28) {
    textblock_append((textblock *)s_local,"Adds");
    shape_lore_append_list((textblock *)s_local,_n,local_28);
    textblock_append((textblock *)s_local,".\n");
    for (local_2c = L'\0'; local_2c < local_28; local_2c = local_2c + L'\x01') {
      string_free(_n[local_2c]);
    }
  }
  mem_free(_n);
  return;
}

Assistant:

static void shape_lore_append_stat_modifiers(textblock *tb,
	const struct player_shape *s)
{
	const char **msgs = NULL;
	int nmax = 0, n = 0;
	int i;

	for (i = 0; i < STAT_MAX; ++i) {
		if (s->modifiers[i] != 0) {
			shape_lore_helper_append_to_list(
				format("%+d to %s",
					s->modifiers[i],
					lookup_obj_property(OBJ_PROPERTY_MOD, i)->name),
				&msgs, &nmax, &n);
		}
	}

	if (n > 0) {
		textblock_append(tb, "Adds");
		shape_lore_append_list(tb, msgs, n);
		textblock_append(tb, ".\n");
		for (i = 0; i < n; ++i) {
			string_free((char*) msgs[i]);
		}
	}

	mem_free(msgs);
}